

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O3

float incircleexact(float *pa,float *pb,float *pc,float *pd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float dab [12];
  float cda [12];
  float abc [12];
  float det24y [24];
  float det24x [24];
  float temp8 [8];
  float bcd [12];
  float det48x [48];
  float det48y [48];
  float cdet [96];
  float bdet [96];
  float adet [96];
  float ddet [96];
  float deter [384];
  float cddet [192];
  float abdet [192];
  undefined8 local_15b8;
  float local_15b0;
  float local_15ac;
  undefined8 local_15a8;
  float fStack_15a0;
  float fStack_159c;
  undefined8 local_1598;
  float fStack_1590;
  float fStack_158c;
  undefined8 local_1588;
  float local_1580;
  float local_157c;
  undefined8 local_1578;
  float local_1570;
  float local_156c;
  undefined8 local_1568;
  float local_1560;
  float local_155c;
  float local_1558 [12];
  float local_1528 [12];
  float local_14f8 [12];
  float local_14c8 [24];
  float local_1468 [24];
  float local_1408 [8];
  float local_13e8 [12];
  float local_13b8 [48];
  float local_12f8 [48];
  float local_1238 [96];
  float local_10b8 [96];
  float local_f38 [96];
  float local_db8 [95];
  float afStack_c3c [385];
  float local_638 [192];
  float local_338 [194];
  
  fVar6 = (float)*(undefined8 *)pb;
  fVar8 = (float)((ulong)*(undefined8 *)pb >> 0x20);
  fVar11 = (float)*(undefined8 *)pa;
  fVar13 = (float)((ulong)*(undefined8 *)pa >> 0x20);
  fVar7 = fVar8 * fVar11;
  fVar9 = fVar6 * fVar13;
  fVar28 = splitter * fVar8 - (splitter * fVar8 - fVar8);
  fVar29 = splitter * fVar6 - (splitter * fVar6 - fVar6);
  fVar24 = fVar8 - fVar28;
  fVar25 = fVar6 - fVar29;
  fVar14 = splitter * fVar11 - (splitter * fVar11 - fVar11);
  fVar16 = splitter * fVar13 - (splitter * fVar13 - fVar13);
  fVar26 = fVar11 - fVar14;
  fVar27 = fVar13 - fVar16;
  fVar18 = fVar24 * fVar26 - (((fVar7 - fVar14 * fVar28) - fVar26 * fVar28) - fVar24 * fVar14);
  fVar19 = fVar25 * fVar27 - (((fVar9 - fVar29 * fVar16) - fVar25 * fVar16) - fVar27 * fVar29);
  fVar15 = fVar18 - fVar19;
  fVar10 = fVar7 + fVar15;
  fVar7 = (fVar7 - (fVar10 - (fVar10 - fVar7))) + (fVar15 - (fVar10 - fVar7));
  fVar12 = fVar7 - fVar9;
  fVar14 = -fVar14;
  fVar29 = -fVar29;
  local_15b8 = CONCAT44((fVar7 - (fVar12 + (fVar7 - fVar12))) + ((fVar7 - fVar12) - fVar9),
                        (fVar18 - (fVar15 + (fVar18 - fVar15))) + ((fVar18 - fVar15) - fVar19));
  local_15ac = fVar10 + fVar12;
  local_15b0 = (fVar10 - (local_15ac - (local_15ac - fVar10))) + (fVar12 - (local_15ac - fVar10));
  fVar33 = (float)*(undefined8 *)pc;
  fVar36 = (float)((ulong)*(undefined8 *)pc >> 0x20);
  fVar18 = splitter * fVar33 - (splitter * fVar33 - fVar33);
  fVar30 = splitter * fVar36 - (splitter * fVar36 - fVar36);
  fVar20 = (float)*(undefined8 *)pd;
  fVar22 = (float)((ulong)*(undefined8 *)pd >> 0x20);
  fVar31 = splitter * fVar22 - (splitter * fVar22 - fVar22);
  fVar32 = splitter * fVar20 - (splitter * fVar20 - fVar20);
  fVar34 = fVar33 - fVar18;
  fVar37 = fVar36 - fVar30;
  fVar19 = -fVar18;
  fVar17 = -fVar32;
  fVar21 = fVar22 - fVar31;
  fVar23 = fVar20 - fVar32;
  fVar9 = fVar8 * fVar33;
  fVar10 = fVar6 * fVar36;
  fVar12 = fVar24 * fVar34 - (fVar19 * fVar24 + -fVar34 * fVar28 + fVar19 * fVar28 + fVar9);
  fVar15 = fVar25 * fVar37 - (fVar37 * fVar29 + fVar30 * -fVar25 + fVar30 * fVar29 + fVar10);
  fVar38 = fVar15 - fVar12;
  fVar7 = fVar10 + fVar38;
  fVar35 = (fVar10 - (fVar7 - (fVar7 - fVar10))) + (fVar38 - (fVar7 - fVar10));
  fVar10 = fVar35 - fVar9;
  local_1568 = CONCAT44((fVar35 - ((fVar35 - fVar10) + fVar10)) + ((fVar35 - fVar10) - fVar9),
                        (fVar15 - (fVar38 + (fVar15 - fVar38))) + ((fVar15 - fVar38) - fVar12));
  local_155c = fVar7 + fVar10;
  local_1560 = (fVar7 - (local_155c - (local_155c - fVar7))) + (fVar10 - (local_155c - fVar7));
  fVar7 = fVar33 * fVar22;
  fVar9 = fVar36 * fVar20;
  fVar12 = fVar34 * fVar21 - (((fVar7 - fVar18 * fVar31) - fVar31 * fVar34) - fVar21 * fVar18);
  fVar18 = fVar37 * fVar23 - (((fVar9 - fVar32 * fVar30) - fVar30 * fVar23) - fVar37 * fVar32);
  fVar32 = fVar12 - fVar18;
  fVar15 = fVar7 + fVar32;
  fVar7 = (fVar7 - (fVar15 - (fVar15 - fVar7))) + (fVar32 - (fVar15 - fVar7));
  fVar10 = fVar7 - fVar9;
  local_1578 = CONCAT44((fVar7 - (fVar10 + (fVar7 - fVar10))) + ((fVar7 - fVar10) - fVar9),
                        (fVar12 - (fVar32 + (fVar12 - fVar32))) + ((fVar12 - fVar32) - fVar18));
  local_156c = fVar15 + fVar10;
  local_1570 = (fVar15 - (local_156c - (local_156c - fVar15))) + (fVar10 - (local_156c - fVar15));
  fVar15 = fVar11 * fVar22;
  fVar18 = fVar13 * fVar20;
  fVar7 = fVar26 * fVar21 - (fVar21 * fVar14 + -fVar26 * fVar31 + fVar14 * fVar31 + fVar15);
  fVar10 = fVar27 * fVar23 - (fVar27 * fVar17 + -fVar23 * fVar16 + fVar17 * fVar16 + fVar18);
  fVar12 = fVar10 - fVar7;
  fVar9 = fVar18 + fVar12;
  fVar18 = (fVar18 - (fVar9 - (fVar9 - fVar18))) + (fVar12 - (fVar9 - fVar18));
  fVar32 = fVar18 - fVar15;
  local_1588 = CONCAT44((fVar18 - ((fVar18 - fVar32) + fVar32)) + ((fVar18 - fVar32) - fVar15),
                        (fVar10 - (fVar12 + (fVar10 - fVar12))) + ((fVar10 - fVar12) - fVar7));
  local_157c = fVar9 + fVar32;
  local_1580 = (fVar9 - (local_157c - (local_157c - fVar9))) + (fVar32 - (local_157c - fVar9));
  fVar9 = fVar36 * fVar11;
  fVar10 = fVar33 * fVar13;
  fVar18 = fVar37 * fVar26 - (fVar37 * fVar14 + -fVar26 * fVar30 + fVar14 * fVar30 + fVar9);
  fVar14 = fVar34 * fVar27 - (fVar27 * fVar19 + -fVar34 * fVar16 + fVar19 * fVar16 + fVar10);
  fVar12 = fVar18 - fVar14;
  fVar7 = fVar9 + fVar12;
  fVar9 = (fVar9 - (fVar7 - (fVar7 - fVar9))) + (fVar12 - (fVar7 - fVar9));
  fVar15 = fVar9 - fVar10;
  local_1598._0_4_ = (fVar18 - (fVar12 + (fVar18 - fVar12))) + ((fVar18 - fVar12) - fVar14);
  local_1598._4_4_ = (fVar9 - (fVar15 + (fVar9 - fVar15))) + ((fVar9 - fVar15) - fVar10);
  fStack_158c = fVar7 + fVar15;
  fStack_1590 = (fVar7 - (fStack_158c - (fStack_158c - fVar7))) + (fVar15 - (fStack_158c - fVar7));
  fVar10 = fVar22 * fVar6;
  fVar14 = fVar20 * fVar8;
  fVar9 = fVar25 * fVar21 - (fVar21 * fVar29 + -fVar25 * fVar31 + fVar29 * fVar31 + fVar10);
  fVar15 = fVar24 * fVar23 - (fVar24 * fVar17 + -fVar23 * fVar28 + fVar17 * fVar28 + fVar14);
  fVar18 = fVar9 - fVar15;
  fVar7 = fVar10 + fVar18;
  fVar10 = (fVar10 - (fVar7 - (fVar7 - fVar10))) + (fVar18 - (fVar7 - fVar10));
  fVar12 = fVar10 - fVar14;
  local_15a8._0_4_ = (fVar9 - (fVar18 + (fVar9 - fVar18))) + ((fVar9 - fVar18) - fVar15);
  local_15a8._4_4_ = (fVar10 - (fVar12 + (fVar10 - fVar12))) + ((fVar10 - fVar12) - fVar14);
  fStack_159c = fVar7 + fVar12;
  fStack_15a0 = (fVar7 - (fStack_159c - (fStack_159c - fVar7))) + (fVar12 - (fStack_159c - fVar7));
  iVar1 = fast_expansion_sum_zeroelim(4,(float *)&local_1578,4,(float *)&local_1588,local_1408);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,local_1408,4,(float *)&local_1598,local_1528);
  iVar2 = fast_expansion_sum_zeroelim(4,(float *)&local_1588,4,(float *)&local_15b8,local_1408);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,local_1408,4,(float *)&local_15a8,local_1558);
  fStack_15a0 = -fStack_15a0;
  fStack_159c = -fStack_159c;
  local_15a8 = CONCAT44(local_15a8._4_4_,(float)local_15a8) ^ 0x8000000080000000;
  fStack_1590 = -fStack_1590;
  fStack_158c = -fStack_158c;
  local_1598 = CONCAT44(local_1598._4_4_,(float)local_1598) ^ 0x8000000080000000;
  iVar3 = fast_expansion_sum_zeroelim(4,(float *)&local_15b8,4,(float *)&local_1568,local_1408);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,local_1408,4,(float *)&local_1598,local_14f8);
  iVar4 = fast_expansion_sum_zeroelim(4,(float *)&local_1568,4,(float *)&local_1578,local_1408);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,local_1408,4,(float *)&local_15a8,local_13e8);
  iVar5 = scale_expansion_zeroelim(iVar4,local_13e8,SUB84((double)fVar11,0),local_1468);
  iVar5 = scale_expansion_zeroelim(iVar5,local_1468,SUB84((double)fVar11,0),local_13b8);
  iVar4 = scale_expansion_zeroelim(iVar4,local_13e8,SUB84((double)fVar13,0),local_14c8);
  iVar4 = scale_expansion_zeroelim(iVar4,local_14c8,SUB84((double)fVar13,0),local_12f8);
  iVar4 = fast_expansion_sum_zeroelim(iVar5,local_13b8,iVar4,local_12f8,local_f38);
  iVar5 = scale_expansion_zeroelim(iVar1,local_1528,SUB84((double)fVar6,0),local_1468);
  iVar5 = scale_expansion_zeroelim(iVar5,local_1468,SUB84((double)-fVar6,0),local_13b8);
  iVar1 = scale_expansion_zeroelim(iVar1,local_1528,SUB84((double)fVar8,0),local_14c8);
  iVar1 = scale_expansion_zeroelim(iVar1,local_14c8,SUB84((double)-fVar8,0),local_12f8);
  iVar1 = fast_expansion_sum_zeroelim(iVar5,local_13b8,iVar1,local_12f8,local_10b8);
  iVar5 = scale_expansion_zeroelim(iVar2,local_1558,SUB84((double)fVar33,0),local_1468);
  iVar5 = scale_expansion_zeroelim(iVar5,local_1468,SUB84((double)fVar33,0),local_13b8);
  iVar2 = scale_expansion_zeroelim(iVar2,local_1558,SUB84((double)fVar36,0),local_14c8);
  iVar2 = scale_expansion_zeroelim(iVar2,local_14c8,SUB84((double)fVar36,0),local_12f8);
  iVar2 = fast_expansion_sum_zeroelim(iVar5,local_13b8,iVar2,local_12f8,local_1238);
  iVar5 = scale_expansion_zeroelim(iVar3,local_14f8,SUB84((double)fVar20,0),local_1468);
  iVar5 = scale_expansion_zeroelim(iVar5,local_1468,SUB84((double)-fVar20,0),local_13b8);
  iVar3 = scale_expansion_zeroelim(iVar3,local_14f8,SUB84((double)fVar22,0),local_14c8);
  iVar3 = scale_expansion_zeroelim(iVar3,local_14c8,SUB84((double)-fVar22,0),local_12f8);
  iVar3 = fast_expansion_sum_zeroelim(iVar5,local_13b8,iVar3,local_12f8,local_db8);
  iVar1 = fast_expansion_sum_zeroelim(iVar4,local_f38,iVar1,local_10b8,local_338);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,local_1238,iVar3,local_db8,local_638);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,local_338,iVar2,local_638,afStack_c3c + 1);
  return afStack_c3c[iVar1];
}

Assistant:

REAL incircleexact(pa, pb, pc, pd)
REAL *pa;
REAL *pb;
REAL *pc;
REAL *pd;
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxay1, axcy1, bxdy1;
  INEXACT REAL bxay1, cxby1, dxcy1, axdy1, cxay1, dxby1;
  REAL axby0, bxcy0, cxdy0, dxay0, axcy0, bxdy0;
  REAL bxay0, cxby0, dxcy0, axdy0, cxay0, dxby0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  REAL temp8[8];
  int templen;
  REAL abc[12], bcd[12], cda[12], dab[12];
  int abclen, bcdlen, cdalen, dablen;
  REAL det24x[24], det24y[24], det48x[48], det48y[48];
  int xlen, ylen;
  REAL adet[96], bdet[96], cdet[96], ddet[96];
  int alen, blen, clen, dlen;
  REAL abdet[192], cddet[192];
  int ablen, cdlen;
  REAL deter[384];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  templen = fast_expansion_sum_zeroelim(4, cd, 4, da, temp8);
  cdalen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, cda);
  templen = fast_expansion_sum_zeroelim(4, da, 4, ab, temp8);
  dablen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, dab);
  for (i = 0; i < 4; i++) {
    bd[i] = -bd[i];
    ac[i] = -ac[i];
  }
  templen = fast_expansion_sum_zeroelim(4, ab, 4, bc, temp8);
  abclen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, abc);
  templen = fast_expansion_sum_zeroelim(4, bc, 4, cd, temp8);
  bcdlen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, bcd);

  xlen = scale_expansion_zeroelim(bcdlen, bcd, pa[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, pa[0], det48x);
  ylen = scale_expansion_zeroelim(bcdlen, bcd, pa[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, pa[1], det48y);
  alen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, adet);

  xlen = scale_expansion_zeroelim(cdalen, cda, pb[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, -pb[0], det48x);
  ylen = scale_expansion_zeroelim(cdalen, cda, pb[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, -pb[1], det48y);
  blen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, bdet);

  xlen = scale_expansion_zeroelim(dablen, dab, pc[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, pc[0], det48x);
  ylen = scale_expansion_zeroelim(dablen, dab, pc[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, pc[1], det48y);
  clen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, cdet);

  xlen = scale_expansion_zeroelim(abclen, abc, pd[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, -pd[0], det48x);
  ylen = scale_expansion_zeroelim(abclen, abc, pd[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, -pd[1], det48y);
  dlen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, deter);

  return deter[deterlen - 1];
}